

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

shared_ptr<Assimp::FIDoubleValue> __thiscall
Assimp::FIDoubleValue::create(FIDoubleValue *this,vector<double,_std::allocator<double>_> *value)

{
  pointer pdVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer pdVar2;
  shared_ptr<Assimp::FIDoubleValue> sVar3;
  
  pdVar2 = (pointer)operator_new(0x58);
  pdVar2[1] = 2.12199579145934e-314;
  *pdVar2 = (double)&PTR___Sp_counted_ptr_inplace_008c0530;
  pdVar2[2] = (double)&PTR_toString_abi_cxx11__008c0580;
  pdVar2[6] = (double)(pdVar2 + 8);
  pdVar2[7] = 0.0;
  *(undefined1 *)(pdVar2 + 8) = 0;
  *(undefined1 *)(pdVar2 + 10) = 0;
  pdVar1 = (value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2[3] = (double)(value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
  pdVar2[4] = (double)pdVar1;
  pdVar2[5] = (double)(value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
  (value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_FIValue)._vptr_FIValue = (_func_int **)(pdVar2 + 2);
  (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar2;
  sVar3.super___shared_ptr<Assimp::FIDoubleValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sVar3.super___shared_ptr<Assimp::FIDoubleValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Assimp::FIDoubleValue>)
         sVar3.super___shared_ptr<Assimp::FIDoubleValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FIDoubleValue> FIDoubleValue::create(std::vector<double> &&value) {
    return std::make_shared<FIDoubleValueImpl>(std::move(value));
}